

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

int foldarith(BinOpr opr,ExpDesc *e1,ExpDesc *e2)

{
  undefined8 *in_RDX;
  double *in_RSI;
  undefined4 in_EDI;
  double dVar1;
  lua_Number n;
  TValue o;
  int local_14;
  
  if ((((*(int *)(in_RSI + 1) == 4) && (*(int *)((long)in_RSI + 0xc) == *(int *)(in_RSI + 2))) &&
      (*(int *)(in_RDX + 1) == 4)) && (*(int *)((long)in_RDX + 0xc) == *(int *)(in_RDX + 2))) {
    dVar1 = (double)lj_vm_foldarith(*in_RSI,*in_RDX,in_EDI);
    if ((NAN(dVar1)) || (dVar1 == -0.0)) {
      local_14 = 0;
    }
    else {
      *in_RSI = dVar1;
      local_14 = 1;
    }
  }
  else {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

static int foldarith(BinOpr opr, ExpDesc *e1, ExpDesc *e2)
{
  TValue o;
  lua_Number n;
  if (!expr_isnumk_nojump(e1) || !expr_isnumk_nojump(e2)) return 0;
  n = lj_vm_foldarith(expr_numberV(e1), expr_numberV(e2), (int)opr-OPR_ADD);
  setnumV(&o, n);
  if (tvisnan(&o) || tvismzero(&o)) return 0;  /* Avoid NaN and -0 as consts. */
  if (LJ_DUALNUM) {
    int32_t k = lj_num2int(n);
    if ((lua_Number)k == n) {
      setintV(&e1->u.nval, k);
      return 1;
    }
  }
  setnumV(&e1->u.nval, n);
  return 1;
}